

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection.cpp
# Opt level: O3

void __thiscall
QHttp2Connection::connectionError(QHttp2Connection *this,Http2Error errorCode,char *message)

{
  char *pcVar1;
  long lVar2;
  QHttp2Stream *this_00;
  storage_type *psVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  storage_type *psVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QString local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x2a9] != (QHttp2Connection)0x0) goto LAB_001e968b;
  qHttp2ConnectionLog();
  if (((byte)qHttp2ConnectionLog::category.field_2.bools.enabledCritical._q_value._M_base._M_i & 1)
      != 0) {
    local_58 = 2;
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_48 = 0;
    uStack_44 = 0;
    local_40 = qHttp2ConnectionLog::category.name;
    QMessageLogger::critical
              ((char *)&local_58,"[%p] Connection error: %s (%d)",this,message,errorCode);
  }
  this[0x2a9] = (QHttp2Connection)0x1;
  sendGOAWAY(this,errorCode);
  if (message == (char *)0x0) {
    psVar8 = (storage_type *)0x0;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      psVar8 = psVar3 + 1;
      pcVar1 = message + 1 + (long)psVar3;
      psVar3 = psVar8;
    } while (*pcVar1 != '\0');
  }
  lVar7 = *(long *)(this + 0x1c0);
  if (lVar7 == 0) {
    lVar7 = 0;
    uVar6 = 0;
LAB_001e9576:
    if (lVar7 != 0 || uVar6 != 0) goto LAB_001e9582;
  }
  else {
    if (**(char **)(lVar7 + 0x20) == -1) {
      uVar5 = 1;
      do {
        uVar6 = uVar5;
        if (*(ulong *)(lVar7 + 0x10) == uVar6) {
          lVar7 = 0;
          uVar6 = 0;
          break;
        }
        uVar5 = uVar6 + 1;
      } while ((*(char **)(lVar7 + 0x20))[(ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90] == -1);
      goto LAB_001e9576;
    }
    uVar6 = 0;
LAB_001e9582:
    do {
      lVar4 = (uVar6 >> 7) * 0x90;
      lVar2 = *(long *)(*(long *)(lVar7 + 0x20) + 0x80 + lVar4);
      uVar5 = (ulong)*(byte *)((ulong)((uint)uVar6 & 0x7f) + *(long *)(lVar7 + 0x20) + lVar4);
      lVar4 = *(long *)(lVar2 + 8 + uVar5 * 0x18);
      if ((((lVar4 != 0) && (*(int *)(lVar4 + 4) != 0)) &&
          (this_00 = *(QHttp2Stream **)(lVar2 + 0x10 + uVar5 * 0x18), this_00 != (QHttp2Stream *)0x0
          )) && ((*(int *)(this_00 + 0x68) != 0 && (*(int *)(this_00 + 0x68) != 5)))) {
        QVar9.m_data = psVar8;
        QVar9.m_size = (qsizetype)&local_58;
        QString::fromLatin1(QVar9);
        local_78.d.d = (Data *)CONCAT44(uStack_54,local_58);
        local_78.d.ptr = (char16_t *)CONCAT44(uStack_4c,uStack_50);
        local_78.d.size = CONCAT44(uStack_44,local_48);
        QHttp2Stream::finishWithError(this_00,errorCode,&local_78);
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      do {
        if (*(long *)(lVar7 + 0x10) - 1U == uVar6) {
          lVar7 = 0;
          uVar6 = 0;
          break;
        }
        uVar6 = uVar6 + 1;
      } while (*(char *)((ulong)((uint)uVar6 & 0x7f) + (uVar6 >> 7) * 0x90 + *(long *)(lVar7 + 0x20)
                        ) == -1);
    } while ((lVar7 != 0) || (uVar6 != 0));
  }
  QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)0x0);
LAB_001e968b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttp2Connection::connectionError(Http2Error errorCode, const char *message)
{
    Q_ASSERT(message);
    // RFC 9113, 6.8: An endpoint MAY send multiple GOAWAY frames if circumstances change.
    // Anyway, we do not send multiple GOAWAY frames.
    if (m_goingAway)
        return;

    qCCritical(qHttp2ConnectionLog, "[%p] Connection error: %s (%d)", this, message,
               int(errorCode));

    // RFC 9113, 6.8: Endpoints SHOULD always send a GOAWAY frame before closing a connection so
    // that the remote peer can know whether a stream has been partially processed or not.
    m_goingAway = true;
    sendGOAWAY(errorCode);
    auto messageView = QLatin1StringView(message);

    for (QHttp2Stream *stream : std::as_const(m_streams)) {
        if (stream && stream->isActive())
            stream->finishWithError(errorCode, messageView);
    }

    closeSession();
}